

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void primaryexp(LexState *ls,expdesc *v)

{
  int iVar1;
  int b;
  FuncState *fs;
  int c;
  expdesc key;
  
  fs = ls->fs;
  iVar1 = (ls->t).token;
  if (iVar1 == 0x11d) {
    singlevar(ls,v);
  }
  else {
    if (iVar1 != 0x28) {
      luaX_syntaxerror(ls,"unexpected symbol");
    }
    iVar1 = ls->linenumber;
    luaX_next(ls);
    expr(ls,v);
    check_match(ls,0x29,0x28,iVar1);
    luaK_dischargevars(ls->fs,v);
  }
  do {
    while ((iVar1 = (ls->t).token, iVar1 == 0x28 || (iVar1 == 0x11e))) {
LAB_0010d2b5:
      luaK_exp2nextreg(fs,v);
LAB_0010d332:
      funcargs(ls,v);
    }
    if (iVar1 == 0x3a) {
      luaX_next(ls);
      checkname(ls,&key);
      luaK_exp2anyreg(fs,v);
      freeexp(fs,v);
      iVar1 = fs->freereg;
      luaK_reserveregs(fs,2);
      b = (v->u).s.info;
      c = luaK_exp2RK(fs,&key);
      luaK_codeABC(fs,OP_SELF,iVar1,b,c);
      freeexp(fs,&key);
      (v->u).s.info = iVar1;
      v->k = VNONRELOC;
      goto LAB_0010d332;
    }
    if (iVar1 == 0x5b) {
      luaK_exp2anyreg(fs,v);
      yindex(ls,&key);
      luaK_indexed(fs,v,&key);
    }
    else {
      if (iVar1 == 0x7b) goto LAB_0010d2b5;
      if (iVar1 != 0x2e) {
        return;
      }
      field(ls,v);
    }
  } while( true );
}

Assistant:

static void primaryexp(LexState*ls,expdesc*v){
FuncState*fs=ls->fs;
prefixexp(ls,v);
for(;;){
switch(ls->t.token){
case'.':{
field(ls,v);
break;
}
case'[':{
expdesc key;
luaK_exp2anyreg(fs,v);
yindex(ls,&key);
luaK_indexed(fs,v,&key);
break;
}
case':':{
expdesc key;
luaX_next(ls);
checkname(ls,&key);
luaK_self(fs,v,&key);
funcargs(ls,v);
break;
}
case'(':case TK_STRING:case'{':{
luaK_exp2nextreg(fs,v);
funcargs(ls,v);
break;
}
default:return;
}
}
}